

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O0

ErrorCode __thiscall ComponentManager::RemoveService(ComponentManager *this,CID cid)

{
  bool bVar1;
  ClassInfo **ppCVar2;
  iterator local_60;
  ClassInfo *local_58;
  ClassInfo *info;
  undefined1 local_40 [16];
  iterator i;
  ClassInfo match;
  ComponentManager *this_local;
  CID cid_local;
  
  this_local = (ComponentManager *)cid.mId;
  ClassInfo::ClassInfo((ClassInfo *)&i,(CID *)&this_local,(ISupports *)0x0);
  JetHead::list<ComponentManager::ClassInfo_*>::begin
            ((list<ComponentManager::ClassInfo_*> *)(local_40 + 8));
  do {
    JetHead::list<ComponentManager::ClassInfo_*>::end
              ((list<ComponentManager::ClassInfo_*> *)local_40);
    bVar1 = JetHead::list<ComponentManager::ClassInfo_*>::iterator::operator!=
                      ((iterator *)(local_40 + 8),(iterator *)local_40);
    JetHead::list<ComponentManager::ClassInfo_*>::iterator::~iterator((iterator *)local_40);
    if (!bVar1) {
      info._0_4_ = 2;
LAB_0010553f:
      JetHead::list<ComponentManager::ClassInfo_*>::iterator::~iterator((iterator *)(local_40 + 8));
      if ((int)info != 1) {
        cid_local.mId._4_4_ = kNoClass;
      }
      return cid_local.mId._4_4_;
    }
    ppCVar2 = JetHead::list<ComponentManager::ClassInfo_*>::iterator::operator*
                        ((iterator *)(local_40 + 8));
    bVar1 = ClassInfo::operator==(*ppCVar2,(ClassInfo *)&i);
    if (bVar1) {
      ppCVar2 = JetHead::list<ComponentManager::ClassInfo_*>::iterator::operator*
                          ((iterator *)(local_40 + 8));
      local_58 = *ppCVar2;
      (*local_58->mClass->_vptr_ISupports[1])();
      if (local_58 != (ClassInfo *)0x0) {
        operator_delete(local_58,0x10);
      }
      JetHead::list<ComponentManager::ClassInfo_*>::iterator::erase(&local_60);
      JetHead::list<ComponentManager::ClassInfo_*>::iterator::~iterator(&local_60);
      cid_local.mId._4_4_ = kNoError;
      info._0_4_ = 1;
      goto LAB_0010553f;
    }
    JetHead::list<ComponentManager::ClassInfo_*>::iterator::operator++((iterator *)(local_40 + 8));
  } while( true );
}

Assistant:

ErrorCode ComponentManager::RemoveService( CID cid )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	ClassInfo match( cid );

	for (JetHead::list<ClassInfo*>::iterator i = mClasses.begin(); 
		 i != mClasses.end(); ++i)
	{
		if (*(*i) == match)
		{
			ClassInfo *info = *i;
			info->mClass->Release();
			delete info;
			i.erase();
			return kNoError;
		}
	}
	
	return kNoClass;	
}